

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

void __thiscall
entityx::ComponentHelper<Test>::copy_component_to
          (ComponentHelper<Test> *this,Entity source,Entity target)

{
  undefined1 in_stack_ffffffffffffffb8 [16];
  
  Entity::component<____C_A_T_C_H____T_E_S_T____56()::Test,void>(in_stack_ffffffffffffffb8._8_8_);
  ComponentHandle<Test,_entityx::EntityManager>::get(in_stack_ffffffffffffffb8._8_8_);
  Entity::assign_from_copy<____C_A_T_C_H____T_E_S_T____56()::Test>
            (in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_);
  return;
}

Assistant:

void copy_component_to(Entity source, Entity target) override {
    target.assign_from_copy<C>(*(source.component<C>().get()));
  }